

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::NavInitRequestApplyResult(void)

{
  ImVec2 *pIVar1;
  uint uVar2;
  ImGuiID IVar3;
  ImGuiNavLayer IVar4;
  ImGuiID focus_scope_id;
  ImGuiWindow *pIVar5;
  long lVar6;
  ImVec2 IVar7;
  ImGuiContext *pIVar8;
  ImGuiContext *pIVar9;
  ImGuiContext *g;
  
  pIVar9 = GImGui;
  pIVar5 = GImGui->NavWindow;
  if (pIVar5 != (ImGuiWindow *)0x0) {
    uVar2 = (GImGui->NavInitResult).ID;
    if (GImGui->NavId != uVar2) {
      IVar3 = (GImGui->NavInitResult).FocusScopeId;
      GImGui->NavJustMovedFromFocusScopeId = GImGui->NavFocusScopeId;
      pIVar9->NavJustMovedToId = uVar2;
      pIVar9->NavJustMovedToFocusScopeId = IVar3;
      pIVar9->NavJustMovedToKeyMods = 0;
      pIVar9->NavJustMovedToIsTabbing = false;
      pIVar9->NavJustMovedToHasSelectionData =
           (bool)((byte)((uint)(pIVar9->NavInitResult).InFlags >> 0x15) & 1);
    }
    if ((pIVar9->DebugLogFlags & 8) != 0) {
      DebugLog("[nav] NavInitRequest: ApplyResult: NavID 0x%08X in Layer %d Window \"%s\"\n",
               (ulong)uVar2,(ulong)pIVar9->NavLayer,pIVar5->Name);
    }
    pIVar8 = GImGui;
    IVar4 = pIVar9->NavLayer;
    IVar3 = (pIVar9->NavInitResult).ID;
    focus_scope_id = (pIVar9->NavInitResult).FocusScopeId;
    GImGui->NavId = IVar3;
    pIVar8->NavLayer = IVar4;
    SetNavFocusScope(focus_scope_id);
    pIVar5 = pIVar8->NavWindow;
    pIVar5->NavLastIds[IVar4] = IVar3;
    IVar7 = (pIVar9->NavInitResult).RectRel.Max;
    pIVar1 = &pIVar5->NavRectRel[IVar4].Min;
    *pIVar1 = (pIVar9->NavInitResult).RectRel.Min;
    pIVar1[1] = IVar7;
    pIVar8 = GImGui;
    pIVar1 = GImGui->NavWindow->RootWindowForNav->NavPreferredScoringPosRel + GImGui->NavLayer;
    pIVar1->x = 3.4028235e+38;
    pIVar1->y = 3.4028235e+38;
    pIVar9->NavIdIsAlive = true;
    lVar6 = (pIVar9->NavInitResult).SelectionUserData;
    if (lVar6 != -1) {
      pIVar9->NavLastValidSelectionUserData = lVar6;
    }
    if (pIVar9->NavInitRequestFromMove == true) {
      pIVar8->NavMousePosDirty = true;
      pIVar8->NavDisableHighlight = false;
      pIVar8->NavDisableMouseHover = true;
    }
  }
  return;
}

Assistant:

void ImGui::NavInitRequestApplyResult()
{
    // In very rare cases g.NavWindow may be null (e.g. clearing focus after requesting an init request, which does happen when releasing Alt while clicking on void)
    ImGuiContext& g = *GImGui;
    if (!g.NavWindow)
        return;

    ImGuiNavItemData* result = &g.NavInitResult;
    if (g.NavId != result->ID)
    {
        g.NavJustMovedFromFocusScopeId = g.NavFocusScopeId;
        g.NavJustMovedToId = result->ID;
        g.NavJustMovedToFocusScopeId = result->FocusScopeId;
        g.NavJustMovedToKeyMods = 0;
        g.NavJustMovedToIsTabbing = false;
        g.NavJustMovedToHasSelectionData = (result->InFlags & ImGuiItemFlags_HasSelectionUserData) != 0;
    }

    // Apply result from previous navigation init request (will typically select the first item, unless SetItemDefaultFocus() has been called)
    // FIXME-NAV: On _NavFlattened windows, g.NavWindow will only be updated during subsequent frame. Not a problem currently.
    IMGUI_DEBUG_LOG_NAV("[nav] NavInitRequest: ApplyResult: NavID 0x%08X in Layer %d Window \"%s\"\n", result->ID, g.NavLayer, g.NavWindow->Name);
    SetNavID(result->ID, g.NavLayer, result->FocusScopeId, result->RectRel);
    g.NavIdIsAlive = true; // Mark as alive from previous frame as we got a result
    if (result->SelectionUserData != ImGuiSelectionUserData_Invalid)
        g.NavLastValidSelectionUserData = result->SelectionUserData;
    if (g.NavInitRequestFromMove)
        NavRestoreHighlightAfterMove();
}